

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzpargrid.cpp
# Opt level: O0

void __thiscall
TPZGenPartialGrid::ElementConnectivity
          (TPZGenPartialGrid *this,int64_t i,TPZVec<long> *rectangle_nodes)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int *piVar4;
  long *plVar5;
  TPZVec<long> *in_RDX;
  long in_RSI;
  TPZVec<int> *in_RDI;
  int yel;
  int xel;
  
  piVar4 = TPZVec<int>::operator[](in_RDI,0);
  iVar2 = (int)(in_RSI % (long)*piVar4);
  piVar4 = TPZVec<int>::operator[](in_RDI,0);
  iVar3 = (int)(in_RSI / (long)*piVar4);
  piVar4 = TPZVec<int>::operator[](in_RDI,0);
  iVar1 = *piVar4;
  plVar5 = TPZVec<long>::operator[](in_RDX,0);
  *plVar5 = (long)(iVar3 * (iVar1 + 1) + iVar2);
  piVar4 = TPZVec<int>::operator[](in_RDI,0);
  iVar1 = *piVar4;
  plVar5 = TPZVec<long>::operator[](in_RDX,1);
  *plVar5 = (long)(iVar3 * (iVar1 + 1) + iVar2 + 1);
  piVar4 = TPZVec<int>::operator[](in_RDI,0);
  iVar1 = *piVar4;
  plVar5 = TPZVec<long>::operator[](in_RDX,2);
  *plVar5 = (long)((iVar3 + 1) * (iVar1 + 1) + iVar2 + 1);
  piVar4 = TPZVec<int>::operator[](in_RDI,0);
  iVar1 = *piVar4;
  plVar5 = TPZVec<long>::operator[](in_RDX,3);
  *plVar5 = (long)((iVar3 + 1) * (iVar1 + 1) + iVar2);
  return;
}

Assistant:

void TPZGenPartialGrid::ElementConnectivity(int64_t i, TPZVec<int64_t> &rectangle_nodes){
	int xel = i%(fNx[0]);
	int yel = i/(fNx[0]);
	rectangle_nodes[0] = yel*(fNx[0]+1)+xel;
	rectangle_nodes[1] = yel*(fNx[0]+1)+xel+1;
	rectangle_nodes[2] = (yel+1)*(fNx[0]+1)+xel+1;
	rectangle_nodes[3] = (yel+1)*(fNx[0]+1)+xel;
}